

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# machine_6502.cc
# Opt level: O3

void __thiscall testbench::machine_6502::machine_6502(machine_6502 *this)

{
  MOS6502 *pMVar1;
  undefined1 auVar2 [32];
  
  auVar2 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->super_machine_implementation).input = (FILE *)auVar2._0_8_;
  (this->super_machine_implementation).output = (FILE *)auVar2._8_8_;
  (this->super_machine_implementation).monitor_in = (FILE *)auVar2._16_8_;
  (this->super_machine_implementation).monitor_out = (FILE *)auVar2._24_8_;
  (this->super_machine_implementation).trace_out = (FILE *)0x0;
  (this->super_machine_implementation).super_machine._vptr_machine = (_func_int **)&PTR_run_0010b910
  ;
  *(undefined1 (*) [32])&this->memory = auVar2;
  *(undefined1 (*) [32])((long)&(this->mutex).super___mutex_base._M_mutex + 8) =
       ZEXT1632(ZEXT816(0) << 0x40);
  pMVar1 = (MOS6502 *)chipemu::MOS6502::create();
  (this->CPU_6502)._M_t.
  super___uniq_ptr_impl<chipemu::MOS6502,_std::default_delete<chipemu::MOS6502>_>._M_t.
  super__Tuple_impl<0UL,_chipemu::MOS6502_*,_std::default_delete<chipemu::MOS6502>_>.
  super__Head_base<0UL,_chipemu::MOS6502_*,_false>._M_head_impl = pMVar1;
  return;
}

Assistant:

machine_6502::machine_6502():
    CPU_6502(MOS6502::create())
{}